

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::BuiltinPrecisionTests::
FuncCase<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_2,_3>,_tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
::runTest(FuncCase<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_2,_3>,_tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *this)

{
  int iVar1;
  undefined4 extraout_var;
  Statement *stmt_00;
  Random *in_stack_fffffffffffffd78;
  allocator<char> *__a;
  undefined1 local_250 [8];
  StatementP stmt;
  ExprP<tcu::Matrix<float,_2,_3>_> expr;
  string local_228;
  VariableP<deqp::gls::BuiltinPrecisionTests::Void> local_208;
  allocator<char> local_1f1;
  string local_1f0;
  VariableP<deqp::gls::BuiltinPrecisionTests::Void> local_1d0;
  allocator<char> local_1b9;
  string local_1b8;
  VariableP<deqp::gls::BuiltinPrecisionTests::Void> local_198;
  allocator<char> local_181;
  string local_180;
  VariableP<tcu::Matrix<float,_3,_2>_> local_160;
  allocator<char> local_149;
  string local_148;
  VariableP<deqp::gls::BuiltinPrecisionTests::Void> local_128;
  allocator<char> local_111;
  string local_110;
  VariableP<tcu::Matrix<float,_2,_3>_> local_f0 [2];
  undefined1 local_d0 [8];
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_3>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  variables;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  inputs;
  FuncCase<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_2,_3>,_tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *this_local;
  
  iVar1 = (*(this->super_FuncCaseBase).super_PrecisionCase.super_TestCase.super_TestNode.
            _vptr_TestNode[6])();
  generateInputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,3,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>
            ((Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
              *)&variables.out1.
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_state,(BuiltinPrecisionTests *)CONCAT44(extraout_var,iVar1),
             (Samplings<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
              *)&(this->super_FuncCaseBase).super_PrecisionCase.m_ctx.floatFormat,
             (FloatFormat *)(ulong)(this->super_FuncCaseBase).super_PrecisionCase.m_ctx.precision,
             (Precision)(this->super_FuncCaseBase).super_PrecisionCase.m_ctx.numRandoms,
             (size_t)&(this->super_FuncCaseBase).super_PrecisionCase.m_rnd,in_stack_fffffffffffffd78
            );
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_3>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  ::Variables((Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_3>,_deqp::gls::BuiltinPrecisionTests::Void>_>
               *)local_d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"out0",&local_111);
  variable<tcu::Matrix<float,2,3>>((BuiltinPrecisionTests *)local_f0,&local_110);
  VariableP<tcu::Matrix<float,_2,_3>_>::operator=
            ((VariableP<tcu::Matrix<float,_2,_3>_> *)
             &variables.in3.
              super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
              .m_state,local_f0);
  VariableP<tcu::Matrix<float,_2,_3>_>::~VariableP(local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"out1",&local_149);
  variable<deqp::gls::BuiltinPrecisionTests::Void>((BuiltinPrecisionTests *)&local_128,&local_148);
  VariableP<deqp::gls::BuiltinPrecisionTests::Void>::operator=
            ((VariableP<deqp::gls::BuiltinPrecisionTests::Void> *)
             &variables.out0.
              super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_3>_>_>
              .m_state,&local_128);
  VariableP<deqp::gls::BuiltinPrecisionTests::Void>::~VariableP(&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"in0",&local_181);
  variable<tcu::Matrix<float,3,2>>((BuiltinPrecisionTests *)&local_160,&local_180);
  VariableP<tcu::Matrix<float,_3,_2>_>::operator=
            ((VariableP<tcu::Matrix<float,_3,_2>_> *)local_d0,&local_160);
  VariableP<tcu::Matrix<float,_3,_2>_>::~VariableP(&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"in1",&local_1b9);
  variable<deqp::gls::BuiltinPrecisionTests::Void>((BuiltinPrecisionTests *)&local_198,&local_1b8);
  VariableP<deqp::gls::BuiltinPrecisionTests::Void>::operator=
            ((VariableP<deqp::gls::BuiltinPrecisionTests::Void> *)
             &variables.in0.
              super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
              .m_state,&local_198);
  VariableP<deqp::gls::BuiltinPrecisionTests::Void>::~VariableP(&local_198);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"in2",&local_1f1);
  variable<deqp::gls::BuiltinPrecisionTests::Void>((BuiltinPrecisionTests *)&local_1d0,&local_1f0);
  VariableP<deqp::gls::BuiltinPrecisionTests::Void>::operator=
            ((VariableP<deqp::gls::BuiltinPrecisionTests::Void> *)
             &variables.in1.
              super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
              .m_state,&local_1d0);
  VariableP<deqp::gls::BuiltinPrecisionTests::Void>::~VariableP(&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  __a = (allocator<char> *)
        ((long)&expr.super_ContainerExprPBase<tcu::Matrix<float,_2,_3>_>.
                super_ExprPBase<tcu::Matrix<float,_2,_3>_>.
                super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_2,_3>_>_>
                .m_state + 7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"in3",__a);
  variable<deqp::gls::BuiltinPrecisionTests::Void>((BuiltinPrecisionTests *)&local_208,&local_228);
  VariableP<deqp::gls::BuiltinPrecisionTests::Void>::operator=
            ((VariableP<deqp::gls::BuiltinPrecisionTests::Void> *)
             &variables.in2.
              super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
              .m_state,&local_208);
  VariableP<deqp::gls::BuiltinPrecisionTests::Void>::~VariableP(&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&expr.super_ContainerExprPBase<tcu::Matrix<float,_2,_3>_>.
                     super_ExprPBase<tcu::Matrix<float,_2,_3>_>.
                     super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_2,_3>_>_>
                     .m_state + 7));
  applyVar<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,2,3>,tcu::Matrix<float,3,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>
            ((BuiltinPrecisionTests *)
             &stmt.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Statement>.m_state,
             this->m_func,(VariableP<tcu::Matrix<float,_3,_2>_> *)local_d0,
             (VariableP<deqp::gls::BuiltinPrecisionTests::Void> *)
             &variables.in0.
              super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
              .m_state,
             (VariableP<deqp::gls::BuiltinPrecisionTests::Void> *)
             &variables.in1.
              super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
              .m_state,
             (VariableP<deqp::gls::BuiltinPrecisionTests::Void> *)
             &variables.in2.
              super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
              .m_state);
  variableAssignment<tcu::Matrix<float,2,3>>
            ((BuiltinPrecisionTests *)local_250,
             (VariableP<tcu::Matrix<float,_2,_3>_> *)
             &variables.in3.
              super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
              .m_state,
             (ExprP<tcu::Matrix<float,_2,_3>_> *)
             &stmt.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Statement>.m_state);
  stmt_00 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Statement>::operator*
                      ((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Statement> *)local_250);
  PrecisionCase::
  testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,3,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,2,3>,deqp::gls::BuiltinPrecisionTests::Void>>
            ((PrecisionCase *)this,
             (Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_3>,_deqp::gls::BuiltinPrecisionTests::Void>_>
              *)local_d0,
             (Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
              *)&variables.out1.
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_state,stmt_00);
  StatementP::~StatementP((StatementP *)local_250);
  ExprP<tcu::Matrix<float,_2,_3>_>::~ExprP
            ((ExprP<tcu::Matrix<float,_2,_3>_> *)
             &stmt.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Statement>.m_state);
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_3>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  ::~Variables((Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_3>,_deqp::gls::BuiltinPrecisionTests::Void>_>
                *)local_d0);
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  ::~Inputs((Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
             *)&variables.out1.
                super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                .m_state);
  return;
}

Assistant:

void FuncCase<Sig>::runTest (void)
{
	const Inputs<In>	inputs	(generateInputs(getSamplings(),
												m_ctx.floatFormat,
												m_ctx.precision,
												m_ctx.numRandoms,
												m_rnd));
	Variables<In, Out>	variables;

	variables.out0	= variable<Ret>("out0");
	variables.out1	= variable<Void>("out1");
	variables.in0	= variable<Arg0>("in0");
	variables.in1	= variable<Arg1>("in1");
	variables.in2	= variable<Arg2>("in2");
	variables.in3	= variable<Arg3>("in3");

	{
		ExprP<Ret>	expr	= applyVar(m_func,
									   variables.in0, variables.in1,
									   variables.in2, variables.in3);
		StatementP	stmt	= variableAssignment(variables.out0, expr);

		this->testStatement(variables, inputs, *stmt);
	}
}